

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O2

void __thiscall
QCborContainerPrivate::replaceAt_internal
          (QCborContainerPrivate *this,Element *e,QCborValue *value,ContainerDisposition disp)

{
  Element *pEVar1;
  Type TVar2;
  uint uVar3;
  void *__arg;
  ValueFlags VVar4;
  int iVar5;
  ByteData *this_00;
  qptrdiff qVar6;
  undefined4 extraout_var;
  char *block;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_58;
  long lStack_38;
  QCborContainerPrivate *pQVar7;
  
  if (value->container == (QCborContainerPrivate *)0x0) {
    TVar2 = value->t;
    e->field_0 = (anon_union_8_2_4ee71171_for_Element_0)value->n;
    e->type = TVar2;
    (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = 0;
    if ((value->t & 0xffffffdf) == Array) {
      (e->field_0).value = 0;
    }
    return;
  }
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  __arg = (void *)value->n;
  pQVar7 = value->container;
  if ((long)__arg < 0) {
    if (pQVar7 == this) {
      if (disp == MoveContainer) {
        LOCK();
        (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
             _q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
      }
      iVar5 = clone((__fn *)this,(void *)0xffffffffffffffff,(int)value,__arg);
      pQVar7 = (QCborContainerPrivate *)CONCAT44(extraout_var,iVar5);
      QList<QtCbor::Element>::detach(&pQVar7->elements);
      (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> = (__atomic_base<int>)0x1;
      (e->field_0).container = pQVar7;
    }
    else {
      (e->field_0).container = pQVar7;
      if (disp == CopyContainer) {
        LOCK();
        (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    e->type = value->t;
    (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = 1;
  }
  else {
    pEVar1 = (pQVar7->elements).d.ptr + (long)__arg;
    TVar2 = pEVar1->type;
    VVar4.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (pEVar1->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
    e->field_0 = pEVar1->field_0;
    e->type = TVar2;
    e->flags = (ValueFlags)
               VVar4.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
               super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
    this_00 = byteData(value->container,value->n);
    if (this_00 != (ByteData *)0x0) {
      uVar3 = (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
              super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
      (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = uVar3 & 0xfffffffd;
      if (value->container == this) {
        QStack_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QStack_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QStack_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QtCbor::ByteData::toByteArray((QByteArray *)&QStack_58,this_00);
        compact(this);
        block = QStack_58.ptr;
        if (QStack_58.ptr == (char *)0x0) {
          block = &QByteArray::_empty;
        }
        qVar6 = addByteData(this,block,QStack_58.size);
        (e->field_0).value = qVar6;
        QArrayDataPointer<char>::~QArrayDataPointer(&QStack_58);
      }
      else {
        compact(this);
        qVar6 = addByteData(this,(char *)(this_00 + 1),this_00->len);
        (e->field_0).value = qVar6;
      }
      (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = uVar3;
    }
    if (disp == MoveContainer) {
      deref(value->container);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void replaceAt_internal(QtCbor::Element &e, const QCborValue &value, ContainerDisposition disp)
    {
        if (value.container)
            return replaceAt_complex(e, value, disp);

        e = { value.value_helper(), value.type() };
        if (value.isContainer())
            e.container = nullptr;
    }